

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.hpp
# Opt level: O2

void tcmalloc::ThreadCache::DeleteCache(ThreadCache *cache)

{
  long in_FS_OFFSET;
  
  Clear(cache);
  *(undefined8 *)(in_FS_OFFSET + -8) = 0;
  std::mutex::lock((mutex *)global_lock);
  if (next_cache_steal == cache) {
    next_cache_steal = cache->next;
  }
  CacheListRemove(cache);
  unclaimed_cache_space = unclaimed_cache_space + cache->max_size_;
  FixedAllocator<tcmalloc::ThreadCache>::Free
            ((FixedAllocator<tcmalloc::ThreadCache> *)thread_cache_allocator,cache);
  pthread_mutex_unlock((pthread_mutex_t *)global_lock);
  return;
}

Assistant:

static void DeleteCache(ThreadCache* cache) {
        cache->Clear();
        tls_cache = nullptr;
        global_lock.lock();
        if (next_cache_steal == cache) {
            next_cache_steal = cache->next;
        }
        CacheListRemove(cache);
        unclaimed_cache_space += cache->max_size_;
        thread_cache_allocator.Free(cache);
        global_lock.unlock();
    }